

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

void __thiscall
bal::Container<unsigned_int>::Container(Container<unsigned_int> *this,container_size_t size)

{
  container_size_t size_local;
  Container<unsigned_int> *this_local;
  
  this->data_ = (uint *)0x0;
  this->size_ = 0;
  this->allocated_size_ = 0;
  reserve(this,size);
  this->size_ = size;
  return;
}

Assistant:

Container(const container_size_t size) {
            reserve(size);
            size_ = size;
            /* append(T(0), size); */
        }